

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForeachLoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeachLoopStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ForeachLoopListSyntax&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          ForeachLoopListSyntax *args_3,StatementSyntax *args_4)

{
  Token keyword;
  ForeachLoopListSyntax *loopList;
  Info *in_RCX;
  StatementSyntax *in_RSI;
  undefined8 in_R8;
  ForeachLoopStatementSyntax *in_R9;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  loopList = (ForeachLoopListSyntax *)
             allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
  ;
  keyword.info = in_RCX;
  keyword.kind = (short)in_R8;
  keyword._2_1_ = (char)((ulong)in_R8 >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  keyword.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::ForeachLoopStatementSyntax::ForeachLoopStatementSyntax
            (in_R9,(NamedLabelSyntax *)in_RCX->location,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RCX->rawTextPtr,keyword,
             loopList,in_RSI);
  return (ForeachLoopStatementSyntax *)loopList;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }